

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_schema_entry.cpp
# Opt level: O3

void __thiscall
duckdb::DuckSchemaEntry::DuckSchemaEntry
          (DuckSchemaEntry *this,Catalog *catalog,CreateSchemaInfo *info)

{
  DefaultViewGenerator *this_00;
  DefaultTableFunctionGenerator *this_01;
  DefaultFunctionGenerator *this_02;
  DefaultTypeGenerator *this_03;
  _Head_base<0UL,_duckdb::DefaultGenerator_*,_false> local_a0;
  _Head_base<0UL,_duckdb::DefaultGenerator_*,_false> local_98;
  _Head_base<0UL,_duckdb::DefaultGenerator_*,_false> local_90;
  _Head_base<0UL,_duckdb::DefaultGenerator_*,_false> local_88;
  _Head_base<0UL,_duckdb::DefaultGenerator_*,_false> local_80;
  _Head_base<0UL,_duckdb::DefaultGenerator_*,_false> local_78;
  _Head_base<0UL,_duckdb::DefaultGenerator_*,_false> local_70;
  _Head_base<0UL,_duckdb::DefaultGenerator_*,_false> local_68;
  _Head_base<0UL,_duckdb::DefaultGenerator_*,_false> local_60;
  CatalogSet *local_58;
  CatalogSet *local_50;
  CatalogSet *local_48;
  CatalogSet *local_40;
  CatalogSet *local_38;
  
  SchemaCatalogEntry::SchemaCatalogEntry(&this->super_SchemaCatalogEntry,catalog,info);
  (this->super_SchemaCatalogEntry).super_InCatalogEntry.super_CatalogEntry._vptr_CatalogEntry =
       (_func_int **)&PTR__DuckSchemaEntry_0245b1b0;
  this_00 = (DefaultViewGenerator *)operator_new(0x20);
  DefaultViewGenerator::DefaultViewGenerator(this_00,catalog,&this->super_SchemaCatalogEntry);
  local_68._M_head_impl = (DefaultGenerator *)this_00;
  CatalogSet::CatalogSet
            (&this->tables,catalog,
             (unique_ptr<duckdb::DefaultGenerator,_std::default_delete<duckdb::DefaultGenerator>,_true>
              *)&local_68);
  if ((DefaultViewGenerator *)local_68._M_head_impl != (DefaultViewGenerator *)0x0) {
    (*((DefaultGenerator *)&(local_68._M_head_impl)->_vptr_DefaultGenerator)->_vptr_DefaultGenerator
      [1])();
  }
  local_68._M_head_impl = (DefaultGenerator *)0x0;
  local_70._M_head_impl = (DefaultGenerator *)0x0;
  local_38 = &this->tables;
  CatalogSet::CatalogSet
            (&this->indexes,catalog,
             (unique_ptr<duckdb::DefaultGenerator,_std::default_delete<duckdb::DefaultGenerator>,_true>
              *)&local_70);
  if (local_70._M_head_impl != (DefaultGenerator *)0x0) {
    (*(local_70._M_head_impl)->_vptr_DefaultGenerator[1])();
  }
  local_70._M_head_impl = (DefaultGenerator *)0x0;
  local_40 = &this->indexes;
  this_01 = (DefaultTableFunctionGenerator *)operator_new(0x20);
  DefaultTableFunctionGenerator::DefaultTableFunctionGenerator
            (this_01,catalog,&this->super_SchemaCatalogEntry);
  local_78._M_head_impl = (DefaultGenerator *)this_01;
  CatalogSet::CatalogSet
            (&this->table_functions,catalog,
             (unique_ptr<duckdb::DefaultGenerator,_std::default_delete<duckdb::DefaultGenerator>,_true>
              *)&local_78);
  if ((DefaultTableFunctionGenerator *)local_78._M_head_impl != (DefaultTableFunctionGenerator *)0x0
     ) {
    (*((DefaultGenerator *)&(local_78._M_head_impl)->_vptr_DefaultGenerator)->_vptr_DefaultGenerator
      [1])();
  }
  local_78._M_head_impl = (DefaultGenerator *)0x0;
  local_80._M_head_impl = (DefaultGenerator *)0x0;
  local_48 = &this->table_functions;
  CatalogSet::CatalogSet
            (&this->copy_functions,catalog,
             (unique_ptr<duckdb::DefaultGenerator,_std::default_delete<duckdb::DefaultGenerator>,_true>
              *)&local_80);
  if (local_80._M_head_impl != (DefaultGenerator *)0x0) {
    (*(local_80._M_head_impl)->_vptr_DefaultGenerator[1])();
  }
  local_80._M_head_impl = (DefaultGenerator *)0x0;
  local_58 = &this->pragma_functions;
  local_88._M_head_impl = (DefaultGenerator *)0x0;
  local_50 = &this->copy_functions;
  CatalogSet::CatalogSet
            (local_58,catalog,
             (unique_ptr<duckdb::DefaultGenerator,_std::default_delete<duckdb::DefaultGenerator>,_true>
              *)&local_88);
  if (local_88._M_head_impl != (DefaultGenerator *)0x0) {
    (*(local_88._M_head_impl)->_vptr_DefaultGenerator[1])();
  }
  local_88._M_head_impl = (DefaultGenerator *)0x0;
  this_02 = (DefaultFunctionGenerator *)operator_new(0x20);
  DefaultFunctionGenerator::DefaultFunctionGenerator
            (this_02,catalog,&this->super_SchemaCatalogEntry);
  local_90._M_head_impl = (DefaultGenerator *)this_02;
  CatalogSet::CatalogSet
            (&this->functions,catalog,
             (unique_ptr<duckdb::DefaultGenerator,_std::default_delete<duckdb::DefaultGenerator>,_true>
              *)&local_90);
  if ((DefaultFunctionGenerator *)local_90._M_head_impl != (DefaultFunctionGenerator *)0x0) {
    (*((DefaultGenerator *)&(local_90._M_head_impl)->_vptr_DefaultGenerator)->_vptr_DefaultGenerator
      [1])();
  }
  local_90._M_head_impl = (DefaultGenerator *)0x0;
  local_98._M_head_impl = (DefaultGenerator *)0x0;
  CatalogSet::CatalogSet
            (&this->sequences,catalog,
             (unique_ptr<duckdb::DefaultGenerator,_std::default_delete<duckdb::DefaultGenerator>,_true>
              *)&local_98);
  if (local_98._M_head_impl != (DefaultGenerator *)0x0) {
    (*(local_98._M_head_impl)->_vptr_DefaultGenerator[1])();
  }
  local_98._M_head_impl = (DefaultGenerator *)0x0;
  local_a0._M_head_impl = (DefaultGenerator *)0x0;
  CatalogSet::CatalogSet
            (&this->collations,catalog,
             (unique_ptr<duckdb::DefaultGenerator,_std::default_delete<duckdb::DefaultGenerator>,_true>
              *)&local_a0);
  if (local_a0._M_head_impl != (DefaultGenerator *)0x0) {
    (*(local_a0._M_head_impl)->_vptr_DefaultGenerator[1])();
  }
  local_a0._M_head_impl = (DefaultGenerator *)0x0;
  this_03 = (DefaultTypeGenerator *)operator_new(0x20);
  DefaultTypeGenerator::DefaultTypeGenerator(this_03,catalog,&this->super_SchemaCatalogEntry);
  local_60._M_head_impl = (DefaultGenerator *)this_03;
  CatalogSet::CatalogSet
            (&this->types,catalog,
             (unique_ptr<duckdb::DefaultGenerator,_std::default_delete<duckdb::DefaultGenerator>,_true>
              *)&local_60);
  if ((DefaultTypeGenerator *)local_60._M_head_impl != (DefaultTypeGenerator *)0x0) {
    (*((DefaultGenerator *)&(local_60._M_head_impl)->_vptr_DefaultGenerator)->_vptr_DefaultGenerator
      [1])();
  }
  return;
}

Assistant:

DuckSchemaEntry::DuckSchemaEntry(Catalog &catalog, CreateSchemaInfo &info)
    : SchemaCatalogEntry(catalog, info), tables(catalog, make_uniq<DefaultViewGenerator>(catalog, *this)),
      indexes(catalog), table_functions(catalog, make_uniq<DefaultTableFunctionGenerator>(catalog, *this)),
      copy_functions(catalog), pragma_functions(catalog),
      functions(catalog, make_uniq<DefaultFunctionGenerator>(catalog, *this)), sequences(catalog), collations(catalog),
      types(catalog, make_uniq<DefaultTypeGenerator>(catalog, *this)) {
}